

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIFileOpenDialog::draw(CGUIFileOpenDialog *this)

{
  undefined4 uVar1;
  u32 uVar2;
  int iVar3;
  long *plVar4;
  string<wchar_t> *this_00;
  long in_RDI;
  IGUIFont *font;
  rect<int> rect;
  IGUISkin *skin;
  wchar_t *c;
  IGUIElement *in_stack_ffffffffffffffa0;
  undefined1 local_20 [16];
  long *local_10;
  
  if ((*(byte *)(in_RDI + 0xa0) & 1) != 0) {
    plVar4 = (long *)(**(code **)(**(long **)(in_RDI + 0x128) + 0x60))();
    local_20._0_8_ = *(undefined8 *)(in_RDI + 0x40);
    local_20._8_8_ = *(undefined8 *)(in_RDI + 0x48);
    local_10 = plVar4;
    uVar1 = (**(code **)*plVar4)(plVar4,5);
    c = (wchar_t *)0x0;
    local_20 = (**(code **)(*plVar4 + 0x78))(plVar4,in_RDI,1,uVar1,local_20,in_RDI + 0x50);
    uVar2 = core::string<wchar_t>::size((string<wchar_t> *)0x3b86f7);
    if (uVar2 != 0) {
      local_20._0_4_ = local_20._0_4_ + 2;
      iVar3 = (**(code **)(*local_10 + 0x10))(local_10,2);
      local_20._8_4_ = local_20._8_4_ - (iVar3 + 5);
      this_00 = (string<wchar_t> *)(**(code **)(*local_10 + 0x30))(local_10,2);
      if (this_00 != (string<wchar_t> *)0x0) {
        core::string<wchar_t>::c_str((string<wchar_t> *)0x3b8762);
        core::string<wchar_t>::string<wchar_t>(this_00,c);
        uVar1 = (**(code **)*local_10)(local_10,6);
        (*(code *)**(undefined8 **)this_00)
                  (this_00,&stack0xffffffffffffffa0,local_20,uVar1,0,1,in_RDI + 0x50);
        core::string<wchar_t>::~string((string<wchar_t> *)0x3b87ba);
      }
    }
    IGUIElement::draw(in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void CGUIFileOpenDialog::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();

	core::rect<s32> rect = AbsoluteRect;

	rect = skin->draw3DWindowBackground(this, true, skin->getColor(EGDC_ACTIVE_BORDER),
			rect, &AbsoluteClippingRect);

	if (Text.size()) {
		rect.UpperLeftCorner.X += 2;
		rect.LowerRightCorner.X -= skin->getSize(EGDS_WINDOW_BUTTON_WIDTH) + 5;

		IGUIFont *font = skin->getFont(EGDF_WINDOW);
		if (font)
			font->draw(Text.c_str(), rect,
					skin->getColor(EGDC_ACTIVE_CAPTION),
					false, true, &AbsoluteClippingRect);
	}

	IGUIElement::draw();
}